

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_test.cpp
# Opt level: O3

void evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<8l>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>>>
               (ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_plus<double>,_viennamath::ct_variable<0UL>_>
                *e,double ref_solution)

{
  ostream *poVar1;
  return_type rVar2;
  vector<double,_std::allocator<double>_> local_50;
  undefined1 local_38 [8];
  double local_30;
  undefined **local_28;
  long local_20;
  
  local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x18);
  local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 3;
  *local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 4.0;
  local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = 6.0;
  local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[2] = 8.0;
  local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  poVar1 = viennamath::operator<<((ostream *)&std::cout,e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," at STL (",9);
  poVar1 = std::ostream::_M_insert<double>
                     (*local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>
                     (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>
                     (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  rVar2 = viennamath::ct_variable<0ul>::operator()((ct_variable<0ul> *)&e->field_0x1,&local_50);
  poVar1 = std::ostream::_M_insert<double>(rVar2 + 8.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  rVar2 = viennamath::ct_variable<0ul>::operator()((ct_variable<0ul> *)(local_38 + 1),&local_50);
  poVar1 = std::ostream::_M_insert<double>(rVar2 + 8.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (reference solution: ",0x16);
  poVar1 = std::ostream::_M_insert<double>(ref_solution);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  rVar2 = viennamath::ct_variable<0ul>::operator()((ct_variable<0ul> *)(local_38 + 1),&local_50);
  if (rVar2 + 8.0 <= ref_solution) {
    rVar2 = viennamath::ct_variable<0ul>::operator()((ct_variable<0ul> *)(local_38 + 1),&local_50);
    if (ref_solution <= rVar2 + 8.0) {
      poVar1 = viennamath::operator<<((ostream *)&std::cout,e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," at vector_3 (",0xe);
      local_38 = (undefined1  [8])&PTR__rt_expression_interface_0013f7f0;
      local_30 = 4.0;
      local_28 = &PTR__rt_expression_interface_0013f8b0;
      local_20 = 6;
      poVar1 = viennamath::operator<<
                         (poVar1,(ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
                                  *)local_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
      poVar1 = std::ostream::_M_insert<double>(12.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
      poVar1 = std::ostream::_M_insert<double>(12.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," (reference solution: ",0x16);
      poVar1 = std::ostream::_M_insert<double>(ref_solution);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      if ((ref_solution == 12.0) && (!NAN(ref_solution))) {
        if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        return;
      }
      __assert_fail("viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) <= ref_solution && viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) >= ref_solution"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/tests/src/compiletime_test.cpp"
                    ,0x4b,
                    "void evaluations_test(const E &, double) [E = viennamath::ct_binary_expr<viennamath::ct_constant<8>, viennamath::op_plus<double>, viennamath::ct_variable<>>]"
                   );
    }
  }
  __assert_fail("viennamath::eval(e, p) <= ref_solution && viennamath::eval(e, p) >= ref_solution",
                "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/tests/src/compiletime_test.cpp"
                ,0x45,
                "void evaluations_test(const E &, double) [E = viennamath::ct_binary_expr<viennamath::ct_constant<8>, viennamath::op_plus<double>, viennamath::ct_variable<>>]"
               );
}

Assistant:

void evaluations_test(E const & e, double ref_solution)
{
  viennamath::rt_constant<double> c4(4.0);
  viennamath::rt_constant<long> c6(6);
  viennamath::ct_constant<8> c8;

  std::vector<double> p(3);
  p[0] = 4;
  p[1] = 6;
  p[2] = 8;

  std::cout << e << " at STL (" << p[0] << ", " << p[1] << ", " << p[2] << ")"
            << " = " << e(p)
            << " = " << viennamath::eval(e,p)
            << " (reference solution: " << ref_solution << ")" << std::endl;
  assert(viennamath::eval(e, p) <= ref_solution && viennamath::eval(e, p) >= ref_solution);

  std::cout << e << " at vector_3 (" << viennamath::make_vector(c4, c6, c8) << ")"
            << " = " << e(viennamath::make_vector(c4, c6, c8))
            << " = " << viennamath::eval(e, viennamath::make_vector(c4, c6, c8))
            << " (reference solution: " << ref_solution << ")" << std::endl;
  assert(viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) <= ref_solution && viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) >= ref_solution);
}